

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# command.cpp
# Opt level: O3

char * debugline(char *p,char *fmt)

{
  char *pcVar1;
  size_t sVar2;
  char *__s;
  uint uVar3;
  stringformatter local_28;
  
  if (sourcestr != (char *)0x0) {
    uVar3 = 1;
    __s = sourcestr;
    while( true ) {
      pcVar1 = strchr(__s,10);
      if (pcVar1 == (char *)0x0) {
        sVar2 = strlen(__s);
        pcVar1 = __s + sVar2;
      }
      if (p <= pcVar1 && __s <= p) break;
      if (*pcVar1 == '\0') {
        return fmt;
      }
      __s = pcVar1 + 1;
      uVar3 = uVar3 + 1;
    }
    if (sourcefile == (char *)0x0) {
      local_28.buf = debugline::buf;
      stringformatter::operator()(&local_28,"%d: %s",(ulong)uVar3,fmt);
    }
    else {
      local_28.buf = debugline::buf;
      stringformatter::operator()(&local_28,"%s:%d: %s",sourcefile,(ulong)uVar3,fmt);
    }
    fmt = debugline::buf;
  }
  return fmt;
}

Assistant:

static const char *debugline(const char *p, const char *fmt)
{
    if(!sourcestr) return fmt;
    int num = 1;
    const char *line = sourcestr;
    for(;;)
    {
        const char *end = strchr(line, '\n');
        if(!end) end = line + strlen(line);
        if(p >= line && p <= end)
        {
            static string buf;
            if(sourcefile) formatstring(buf)("%s:%d: %s", sourcefile, num, fmt);
            else formatstring(buf)("%d: %s", num, fmt);
            return buf;
        }
        if(!*end) break;
        line = end + 1;
        num++;
    }
    return fmt;
}